

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O1

llama_ubatch * __thiscall
llama_sbatch::reserve_ubatch
          (llama_ubatch *__return_storage_ptr__,llama_sbatch *this,size_t n_ubatch,bool has_embd)

{
  pointer plVar1;
  pointer pfVar2;
  size_t *psVar3;
  long lVar4;
  size_t __new_size;
  size_type __new_size_00;
  
  plVar1 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)plVar1 -
          (long)(this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    psVar3 = &plVar1[-1].length;
    do {
      plVar1 = plVar1 + -1;
      if (*psVar3 != 0) break;
      lVar4 = lVar4 + -1;
      (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>._M_impl.
      super__Vector_impl_data._M_finish = plVar1;
      psVar3 = psVar3 + -4;
    } while (lVar4 != 0);
  }
  __new_size = n_ubatch;
  if (has_embd) {
    __new_size = 0;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->ubatch_token,__new_size);
  __new_size_00 = this->n_embd * n_ubatch;
  if (!has_embd) {
    __new_size_00 = 0;
  }
  std::vector<float,_std::allocator<float>_>::resize(&this->ubatch_embd,__new_size_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->ubatch_pos,n_ubatch);
  std::vector<int,_std::allocator<int>_>::resize(&this->ubatch_n_seq_id,n_ubatch);
  std::vector<int_*,_std::allocator<int_*>_>::resize(&this->ubatch_seq_id,n_ubatch);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->ubatch_output,n_ubatch);
  __return_storage_ptr__->equal_seqs = true;
  __return_storage_ptr__->n_tokens = 0;
  __return_storage_ptr__->n_seq_tokens = 0;
  __return_storage_ptr__->n_seqs = 0;
  if (has_embd) {
    __return_storage_ptr__->token = (llama_token *)0x0;
    pfVar2 = (this->ubatch_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    __return_storage_ptr__->token =
         (this->ubatch_token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    pfVar2 = (pointer)0x0;
  }
  __return_storage_ptr__->embd = pfVar2;
  __return_storage_ptr__->pos =
       (this->ubatch_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  __return_storage_ptr__->n_seq_id =
       (this->ubatch_n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  __return_storage_ptr__->seq_id =
       (this->ubatch_seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __return_storage_ptr__->output =
       (this->ubatch_output).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  return __return_storage_ptr__;
}

Assistant:

llama_ubatch llama_sbatch::reserve_ubatch(size_t n_ubatch, bool has_embd) {
    // clear empty sequences
    // the previous ubatch is assumed to be gone,
    // so nothing should refer to values in these sequences anymore.
    for (size_t i = seq.size(); i-- > 0;) {
        if (seq[i].length == 0) {
            seq.pop_back();
        } else {
            break;
        }
    }
    ubatch_token.resize(!has_embd ? n_ubatch : 0);
    ubatch_embd.resize(has_embd ? n_embd * n_ubatch : 0);
    ubatch_pos.resize(n_ubatch);
    ubatch_n_seq_id.resize(n_ubatch);
    ubatch_seq_id.resize(n_ubatch);
    ubatch_output.resize(n_ubatch);
    llama_ubatch ubatch = {
        /*equal_seqs   =*/ true,
        /*n_tokens     =*/ 0,
        /*n_seq_tokens =*/ 0,
        /*n_seqs       =*/ 0,
        /*token        =*/ !has_embd ? ubatch_token.data() : nullptr,
        /*embd         =*/ has_embd  ? ubatch_embd.data()  : nullptr,
        /*pos          =*/ ubatch_pos.data(),
        /*n_seq_id     =*/ ubatch_n_seq_id.data(),
        /*seq_id       =*/ ubatch_seq_id.data(),
        /*output       =*/ ubatch_output.data(),
    };
    return ubatch;
}